

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

LY_ERR ly_ctx_new_yldata(char *search_dir,lyd_node *tree,int options,ly_ctx **ctx)

{
  lyd_node *plVar1;
  byte *pbVar2;
  lysc_node *plVar3;
  long lVar4;
  uint32_t uVar5;
  LY_ERR LVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char **ppcVar10;
  lyd_node *plVar11;
  lys_module *plVar12;
  char *pcVar13;
  anon_union_8_3_0df1e6ad_for_ly_set_2 *paVar14;
  ulong uVar15;
  void *pvVar16;
  LY_ERR LVar17;
  ly_ctx *plVar18;
  ulong uVar19;
  ly_ctx *ctx_new;
  ly_set *set;
  ly_set features;
  ly_set *set_1;
  ly_ctx *local_90;
  ly_set *local_88;
  ly_ctx *local_80;
  ly_set local_78;
  ulong local_60;
  ly_set *local_58;
  LY_ERR local_4c;
  ly_set local_48;
  
  local_88 = (ly_set *)0x0;
  local_78.size = 0;
  local_78.count = 0;
  local_78.field_2.dnodes = (lyd_node **)0x0;
  local_90 = (ly_ctx *)0x0;
  if (tree == (lyd_node *)0x0) {
    pcVar8 = "tree";
  }
  else {
    if (ctx != (ly_ctx **)0x0) {
      plVar18 = *ctx;
      if ((*ctx != (ly_ctx *)0x0) ||
         (LVar6 = ly_ctx_new(search_dir,(uint16_t)options,&local_90), plVar18 = local_90,
         LVar6 == LY_SUCCESS)) {
        local_90 = plVar18;
        LVar17 = options & LY_EPLUGIN;
        if (LVar17 == LY_SUCCESS) {
          local_90->flags = local_90->flags | 0x80;
        }
        LVar6 = lyd_find_xpath(tree,"/ietf-yang-library:yang-library/module-set[1]/module",&local_88
                              );
        plVar18 = local_90;
        if (LVar6 == LY_SUCCESS) {
          local_4c = LVar17;
          if (local_88->count == 0) {
            local_48.size = 0;
            local_48.count = 0;
            local_48.field_2.dnodes = (lyd_node **)0x0;
            LVar6 = lyd_find_xpath(tree,"/ietf-yang-library:yang-library/modules-state/module",
                                   &local_58);
            if (LVar6 == LY_SUCCESS) {
              if (local_58->count != 0) {
                uVar15 = 0;
                local_80 = plVar18;
                do {
                  plVar1 = (local_58->field_2).dnodes[uVar15];
                  if ((plVar1 == (lyd_node *)0x0) ||
                     ((plVar1->schema != (lysc_node *)0x0 &&
                      ((plVar1->schema->nodetype & 0x711) == 0)))) {
                    pvVar16 = (void *)0x0;
                  }
                  else {
                    pvVar16 = *(void **)(plVar1 + 1);
                  }
                  local_60 = uVar15;
                  if (pvVar16 == (void *)0x0) {
                    pcVar8 = (char *)0x0;
                    pcVar9 = (char *)0x0;
                  }
                  else {
                    pcVar9 = (char *)0x0;
                    pcVar8 = (char *)0x0;
                    do {
                      pbVar2 = *(byte **)((long)pvVar16 + 8);
                      pcVar13 = *(char **)(pbVar2 + 0x28);
                      iVar7 = strcmp(pcVar13,"name");
                      LVar17 = LVar6;
                      if (iVar7 == 0) {
                        if (pbVar2 == (byte *)0x0) {
                          pcVar8 = *(char **)((long)pvVar16 + 0x58);
                        }
                        else if ((*pbVar2 & 0xc) == 0) {
                          pcVar8 = (char *)0x0;
                        }
                        else {
                          pcVar8 = *(char **)((long)pvVar16 + 0x38);
                          if (pcVar8 == (char *)0x0) {
                            pcVar8 = lyd_value_get_canonical
                                               ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                                (lyd_value *)((long)pvVar16 + 0x38));
                          }
                        }
                      }
                      else {
                        iVar7 = strcmp(pcVar13,"revision");
                        if (iVar7 == 0) {
                          if (pbVar2 == (byte *)0x0) {
                            pcVar9 = *(char **)((long)pvVar16 + 0x58);
                          }
                          else if ((*pbVar2 & 0xc) == 0) {
                            pcVar9 = (char *)0x0;
                          }
                          else {
                            pcVar9 = *(char **)((long)pvVar16 + 0x38);
                            if (pcVar9 == (char *)0x0) {
                              pcVar9 = lyd_value_get_canonical
                                                 ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                                  (lyd_value *)((long)pvVar16 + 0x38));
                            }
                          }
                        }
                        else {
                          iVar7 = strcmp(pcVar13,"feature");
                          if (iVar7 == 0) {
                            LVar6 = ly_set_add(&local_48,pvVar16,'\0',(uint32_t *)0x0);
                            LVar17 = LY_SUCCESS;
                            if (LVar6 != LY_SUCCESS) goto LAB_0011c4af;
                          }
                          else {
                            iVar7 = strcmp(pcVar13,"conformance-type");
                            if (iVar7 == 0) {
                              if (pbVar2 == (byte *)0x0) {
                                pcVar13 = *(char **)((long)pvVar16 + 0x58);
                              }
                              else {
                                pcVar13 = *(char **)((long)pvVar16 + 0x38);
                                if (pcVar13 == (char *)0x0) {
                                  pcVar13 = lyd_value_get_canonical
                                                      ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                                       (lyd_value *)((long)pvVar16 + 0x38));
                                }
                              }
                              iVar7 = strcmp(pcVar13,"import");
                              if (iVar7 == 0) goto LAB_0011c443;
                            }
                          }
                        }
                      }
                      LVar6 = LVar17;
                      pvVar16 = *(void **)((long)pvVar16 + 0x18);
                    } while (pvVar16 != (void *)0x0);
                  }
                  uVar5 = local_48.count;
                  uVar15 = (ulong)local_48.count;
                  ppcVar10 = (char **)malloc((ulong)(local_48.count + 1) << 3);
                  if (ppcVar10 == (char **)0x0) {
                    LVar6 = LY_EMEM;
                    break;
                  }
                  if (uVar5 != 0) {
                    uVar19 = 0;
                    do {
                      plVar1 = local_48.field_2.dnodes[uVar19];
                      if (plVar1 == (lyd_node *)0x0) {
LAB_0011c3e7:
                        plVar11 = (lyd_node *)0x0;
                      }
                      else {
                        plVar3 = plVar1->schema;
                        if (plVar3 == (lysc_node *)0x0) {
                          plVar11 = plVar1[1].prev;
                        }
                        else {
                          if ((plVar3->nodetype & 0xc) == 0) goto LAB_0011c3e7;
                          plVar11 = *(lyd_node **)(plVar1 + 1);
                          if (plVar11 == (lyd_node *)0x0) {
                            plVar11 = (lyd_node *)
                                      lyd_value_get_canonical
                                                (plVar3->module->ctx,(lyd_value *)(plVar1 + 1));
                          }
                        }
                      }
                      ppcVar10[uVar19] = (char *)plVar11;
                      uVar19 = uVar19 + 1;
                      uVar15 = (ulong)local_48._0_8_ >> 0x20;
                    } while (uVar19 < uVar15);
                  }
                  ppcVar10[uVar15] = (char *)0x0;
                  ly_set_clean(&local_48,free);
                  plVar12 = ly_ctx_load_module(local_80,pcVar8,pcVar9,ppcVar10);
                  free(ppcVar10);
                  if (plVar12 == (lys_module *)0x0) {
                    LVar6 = LY_EINVAL;
                    ly_log(local_80,LY_LLERR,LY_EINVAL,
                           "Unable to load module specified by yang library data.");
                    goto LAB_0011c4c0;
                  }
LAB_0011c443:
                  uVar15 = local_60 + 1;
                } while (uVar15 < local_58->count);
              }
LAB_0011c4af:
              ly_set_clean(&local_48,free);
LAB_0011c4c0:
              ly_set_free(local_58,free);
            }
            if (LVar6 != LY_SUCCESS) goto LAB_0011c4e9;
          }
          else {
            local_80 = (ly_ctx *)tree;
            if (local_88->count != 0) {
              uVar15 = 0;
              do {
                plVar1 = (local_88->field_2).dnodes[uVar15];
                if ((plVar1 == (lyd_node *)0x0) ||
                   ((plVar1->schema != (lysc_node *)0x0 && ((plVar1->schema->nodetype & 0x711) == 0)
                    ))) {
                  pvVar16 = (void *)0x0;
                }
                else {
                  pvVar16 = *(void **)(plVar1 + 1);
                }
                local_60 = uVar15;
                if (pvVar16 == (void *)0x0) {
                  pcVar9 = (char *)0x0;
                  pcVar8 = (char *)0x0;
                }
                else {
                  pcVar8 = (char *)0x0;
                  pcVar9 = (char *)0x0;
                  do {
                    pbVar2 = *(byte **)((long)pvVar16 + 8);
                    pcVar13 = *(char **)(pbVar2 + 0x28);
                    iVar7 = strcmp(pcVar13,"name");
                    if (iVar7 == 0) {
                      if (pbVar2 == (byte *)0x0) {
                        pcVar8 = *(char **)((long)pvVar16 + 0x58);
                      }
                      else if ((*pbVar2 & 0xc) == 0) {
                        pcVar8 = (char *)0x0;
                      }
                      else {
                        pcVar8 = *(char **)((long)pvVar16 + 0x38);
                        if (pcVar8 == (char *)0x0) {
                          pcVar8 = lyd_value_get_canonical
                                             ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                              (lyd_value *)((long)pvVar16 + 0x38));
                        }
                      }
                    }
                    else {
                      iVar7 = strcmp(pcVar13,"revision");
                      if (iVar7 == 0) {
                        if (pbVar2 == (byte *)0x0) {
                          pcVar9 = *(char **)((long)pvVar16 + 0x58);
                        }
                        else if ((*pbVar2 & 0xc) == 0) {
                          pcVar9 = (char *)0x0;
                        }
                        else {
                          pcVar9 = *(char **)((long)pvVar16 + 0x38);
                          if (pcVar9 == (char *)0x0) {
                            pcVar9 = lyd_value_get_canonical
                                               ((ly_ctx *)**(undefined8 **)(pbVar2 + 8),
                                                (lyd_value *)((long)pvVar16 + 0x38));
                          }
                        }
                      }
                      else {
                        iVar7 = strcmp(pcVar13,"feature");
                        if ((iVar7 == 0) &&
                           (LVar6 = ly_set_add(&local_78,pvVar16,'\0',(uint32_t *)0x0),
                           LVar6 != LY_SUCCESS)) goto LAB_0011c4e9;
                      }
                    }
                    pvVar16 = *(void **)((long)pvVar16 + 0x18);
                  } while (pvVar16 != (void *)0x0);
                }
                ppcVar10 = (char **)malloc((ulong)(local_78.count + 1) << 3);
                if (ppcVar10 == (char **)0x0) {
                  LVar6 = LY_EMEM;
                  goto LAB_0011c4e9;
                }
                uVar15 = (ulong)local_78.count;
                if (local_78.count != 0) {
                  uVar19 = 0;
                  do {
                    plVar1 = local_78.field_2.dnodes[uVar19];
                    if (plVar1 == (lyd_node *)0x0) {
LAB_0011c0ee:
                      plVar11 = (lyd_node *)0x0;
                    }
                    else {
                      plVar3 = plVar1->schema;
                      if (plVar3 == (lysc_node *)0x0) {
                        plVar11 = plVar1[1].prev;
                      }
                      else {
                        if ((plVar3->nodetype & 0xc) == 0) goto LAB_0011c0ee;
                        plVar11 = *(lyd_node **)(plVar1 + 1);
                        if (plVar11 == (lyd_node *)0x0) {
                          plVar11 = (lyd_node *)
                                    lyd_value_get_canonical
                                              (plVar3->module->ctx,(lyd_value *)(plVar1 + 1));
                        }
                      }
                    }
                    ppcVar10[uVar19] = (char *)plVar11;
                    uVar19 = uVar19 + 1;
                    uVar15 = (ulong)local_78._0_8_ >> 0x20;
                  } while (uVar19 < uVar15);
                }
                ppcVar10[uVar15] = (char *)0x0;
                ly_set_clean(&local_78,(_func_void_void_ptr *)0x0);
                plVar12 = ly_ctx_load_module(local_90,pcVar8,pcVar9,ppcVar10);
                free(ppcVar10);
                if (plVar12 == (lys_module *)0x0) {
                  plVar18 = *ctx;
                  if (plVar18 == (ly_ctx *)0x0) {
                    lVar4 = (local_80->dict).lock.__align;
                    if (lVar4 == 0) {
                      paVar14 = &(local_80->unres).implementing.field_2;
                    }
                    else {
                      paVar14 = *(anon_union_8_3_0df1e6ad_for_ly_set_2 **)(lVar4 + 8);
                    }
                    plVar18 = (ly_ctx *)paVar14->dnodes;
                  }
                  pcVar13 = "<none>";
                  if (pcVar9 != (char *)0x0) {
                    pcVar13 = pcVar9;
                  }
                  LVar6 = LY_EINVAL;
                  ly_log(plVar18,LY_LLERR,LY_EINVAL,
                         "Unable to load module %s@%s specified by yang library data.",pcVar8,
                         pcVar13);
                  goto LAB_0011c4e9;
                }
                uVar15 = local_60 + 1;
              } while (uVar15 < local_88->count);
            }
          }
          LVar6 = ly_ctx_compile(local_90);
          local_4c = local_4c | LVar6;
          if (local_4c == LY_SUCCESS) {
            local_90->flags = local_90->flags & 0xff7f;
            LVar6 = LY_SUCCESS;
          }
        }
      }
LAB_0011c4e9:
      ly_set_free(local_88,(_func_void_void_ptr *)0x0);
      ly_set_erase(&local_78,(_func_void_void_ptr *)0x0);
      if (*ctx != (ly_ctx *)0x0) {
        return LVar6;
      }
      *ctx = local_90;
      if (LVar6 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      ly_ctx_destroy(local_90);
      *ctx = (ly_ctx *)0x0;
      return LVar6;
    }
    pcVar8 = "ctx";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar8,"ly_ctx_new_yldata");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_yldata(const char *search_dir, const struct lyd_node *tree, int options, struct ly_ctx **ctx)
{
    const char *name = NULL, *revision = NULL;
    struct lyd_node *module, *node;
    struct ly_set *set = NULL;
    const char **feature_arr = NULL;
    struct ly_set features = {0};
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *mod;
    struct ly_ctx *ctx_new = NULL;
    ly_bool no_expl_compile = 0;
    uint32_t i, j;

    LY_CHECK_ARG_RET(NULL, tree, ctx, LY_EINVAL);

    /* create a new context */
    if (*ctx == NULL) {
        LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, options, &ctx_new), cleanup);
    } else {
        ctx_new = *ctx;
    }

    /* redundant to compile modules one-by-one */
    if (!(options & LY_CTX_EXPLICIT_COMPILE)) {
        ctx_new->flags |= LY_CTX_EXPLICIT_COMPILE;
        no_expl_compile = 1;
    }

    LY_CHECK_GOTO(ret = lyd_find_xpath(tree, "/ietf-yang-library:yang-library/module-set[1]/module", &set), cleanup);
    if (set->count == 0) {
        /* perhaps a legacy data tree? */
        LY_CHECK_GOTO(ret = ly_ctx_new_yl_legacy(ctx_new, tree), cleanup);
    } else {
        /* process the data tree */
        for (i = 0; i < set->count; ++i) {
            module = set->dnodes[i];

            /* initiate */
            name = NULL;
            revision = NULL;

            /* iterate over data */
            LY_LIST_FOR(lyd_child(module), node) {
                if (!strcmp(node->schema->name, "name")) {
                    name = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "revision")) {
                    revision = lyd_get_value(node);
                } else if (!strcmp(node->schema->name, "feature")) {
                    LY_CHECK_GOTO(ret = ly_set_add(&features, node, 0, NULL), cleanup);
                }
            }

            feature_arr = malloc((features.count + 1) * sizeof *feature_arr);
            LY_CHECK_ERR_GOTO(!feature_arr, ret = LY_EMEM, cleanup);

            /* parse features into an array of strings */
            for (j = 0; j < features.count; ++j) {
                feature_arr[j] = lyd_get_value(features.dnodes[j]);
            }
            feature_arr[features.count] = NULL;
            ly_set_clean(&features, NULL);

            /* use the gathered data to load the module */
            mod = ly_ctx_load_module(ctx_new, name, revision, feature_arr);
            free(feature_arr);
            if (!mod) {
                LOGERR(*ctx ? *ctx : LYD_CTX(tree), LY_EINVAL, "Unable to load module %s@%s specified by yang library data.",
                        name, revision ? revision : "<none>");
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* compile */
    LY_CHECK_GOTO(ret = ly_ctx_compile(ctx_new), cleanup);

    if (no_expl_compile) {
        /* unset flag */
        ctx_new->flags &= ~LY_CTX_EXPLICIT_COMPILE;
    }

cleanup:
    ly_set_free(set, NULL);
    ly_set_erase(&features, NULL);
    if (*ctx == NULL) {
        *ctx = ctx_new;
        if (ret) {
            ly_ctx_destroy(*ctx);
            *ctx = NULL;
        }
    }
    return ret;
}